

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Coefficients::Coefficients(Coefficients *this,Coefficients *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Coefficients_003c35c0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->alpha_).current_size_ = 0;
  (this->alpha_).total_size_ = 0;
  (this->alpha_).rep_ = (Rep *)0x0;
  new_size = (from->alpha_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->alpha_,new_size);
    memcpy(((this->alpha_).rep_)->elements,((from->alpha_).rep_)->elements,
           (long)(from->alpha_).current_size_ << 3);
    (this->alpha_).current_size_ = (from->alpha_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

Coefficients::Coefficients(const Coefficients& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      alpha_(from.alpha_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Coefficients)
}